

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetTreeForNested
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  _Base_ptr p_Var1;
  ParseInfoTree *pPVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  CheckFieldIndex(field,index);
  p_Var4 = &(this->nested_)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var4->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(FieldDescriptor **)(p_Var3 + 1) < field]) {
    if (*(FieldDescriptor **)(p_Var3 + 1) >= field) {
      p_Var1 = p_Var3;
    }
  }
  p_Var3 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var4) &&
     (p_Var3 = p_Var1, field < *(FieldDescriptor **)(p_Var1 + 1))) {
    p_Var3 = &p_Var4->_M_header;
  }
  pPVar2 = (ParseInfoTree *)0x0;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    if (index == -1) {
      index = 0;
    }
    if ((ulong)(long)index < (ulong)((long)p_Var3[1]._M_left - (long)p_Var3[1]._M_parent >> 3)) {
      pPVar2 = *(ParseInfoTree **)(&(p_Var3[1]._M_parent)->_M_color + (long)index * 2);
    }
  }
  return pPVar2;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::GetTreeForNested(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  auto it = nested_.find(field);
  if (it == nested_.end() || index >= it->second.size()) {
    return nullptr;
  }

  return it->second[index].get();
}